

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_delete.cpp
# Opt level: O1

void __thiscall duckdb::DeleteGlobalState::~DeleteGlobalState(DeleteGlobalState *this)

{
  _Head_base<0UL,_duckdb::ConstraintState_*,_false> _Var1;
  
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__DeleteGlobalState_024a8940;
  _Var1._M_head_impl =
       (this->delete_index_append_state).constraint_state.
       super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
       .super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (ConstraintState *)0x0) {
    operator_delete(_Var1._M_head_impl);
  }
  (this->delete_index_append_state).constraint_state.
  super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t.
  super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>.
  super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl = (ConstraintState *)0x0;
  TableAppendState::~TableAppendState(&(this->delete_index_append_state).append_state);
  ColumnDataCollection::~ColumnDataCollection(&this->return_collection);
  ::std::vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>::~vector
            (&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
              super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>);
  operator_delete(this);
  return;
}

Assistant:

explicit DeleteGlobalState(ClientContext &context, const vector<LogicalType> &return_types,
	                           TableCatalogEntry &table, const vector<unique_ptr<BoundConstraint>> &bound_constraints)
	    : deleted_count(0), return_collection(context, return_types), has_unique_indexes(false) {

		// We need to append deletes to the local delete-ART.
		auto &storage = table.GetStorage();
		if (storage.HasUniqueIndexes()) {
			storage.InitializeLocalStorage(delete_index_append_state, table, context, bound_constraints);
			has_unique_indexes = true;
		}
	}